

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::AddBox(Element *this,Box *box,Vector2f offset)

{
  PositionedBox local_58;
  
  local_58.box.area_edges[2]._8_8_ = *(undefined8 *)(box->area_edges[2] + 2);
  local_58.box.content = box->content;
  local_58.box.area_edges[0]._0_8_ = *(undefined8 *)box->area_edges[0];
  local_58.box.area_edges[0]._8_8_ = *(undefined8 *)(box->area_edges[0] + 2);
  local_58.box.area_edges[1]._0_8_ = *(undefined8 *)box->area_edges[1];
  local_58.box.area_edges[1]._8_8_ = *(undefined8 *)(box->area_edges[1] + 2);
  local_58.box.area_edges[2]._0_8_ = *(undefined8 *)box->area_edges[2];
  local_58.offset = offset;
  ::std::vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::
  emplace_back<Rml::Element::PositionedBox>(&this->additional_boxes,&local_58);
  Box::~Box(&local_58.box);
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xc])(this);
  ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
  ElementBackgroundBorder::DirtyBorder(&this->meta->background_border);
  ElementEffects::DirtyEffectsData(&this->meta->effects);
  return;
}

Assistant:

void Element::AddBox(const Box& box, Vector2f offset)
{
	additional_boxes.emplace_back(PositionedBox{box, offset});
	OnResize();
	meta->background_border.DirtyBackground();
	meta->background_border.DirtyBorder();
	meta->effects.DirtyEffectsData();
}